

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O3

void __thiscall
Address_ElementsHashDataConstructorTest_Test::~Address_ElementsHashDataConstructorTest_Test
          (Address_ElementsHashDataConstructorTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Address, ElementsHashDataConstructorTest) {
  Address addr;
  for (ElementsUnblindedAddressTestVector test : test_vectors) {
    // hash data constructor
    {
      ByteData hash;
      if ((test.addr_type == AddressType::kP2wpkhAddress)
          || (test.addr_type == AddressType::kP2wshAddress)) {
        // p2pkh constructor
        if (!test.pubkey.GetHex().empty()) {
          hash = ByteData(HashUtil::Hash160(test.pubkey).GetBytes());
        }
        // p2sh constructor
        else if (!test.script.GetHex().empty()) {
          hash = ByteData(HashUtil::Sha256(test.script).GetBytes());
        }
        else {
          EXPECT_FALSE(true);
        }
        EXPECT_NO_THROW((addr = Address(test.net_type, WitnessVersion::kVersion0,
            hash, GetElementsAddressFormatList())));
      } else {
        // p2pkh constructor
        ByteData160 hash160;
        if (!test.pubkey.GetHex().empty()) {
          hash160 = HashUtil::Hash160(test.pubkey);
        }
        // p2sh constructor
        else if (!test.script.GetHex().empty()) {
          hash160 = HashUtil::Hash160(test.script);
        }
        else {
          EXPECT_FALSE(true);
        }
        EXPECT_NO_THROW((addr = Address(test.net_type, test.addr_type, hash160,
            GetElementsAddressFormatList())));
        hash = ByteData(hash160.GetBytes());
      }
      EXPECT_FALSE(ElementsConfidentialAddress::IsConfidentialAddress(test.address, GetElementsAddressFormatList()));
      EXPECT_STREQ(test.address.c_str(), addr.GetAddress().c_str());
      EXPECT_EQ(test.net_type, addr.GetNetType());
      EXPECT_EQ(test.addr_type, addr.GetAddressType());
      EXPECT_STREQ(hash.GetHex().c_str(), addr.GetHash().GetHex().c_str());
    }
  }
}